

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::Switch_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::eval_internal
          (Switch_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this,Dispatch_State *t_ss)

{
  int iVar1;
  Type_Conversions *pTVar2;
  Dispatch_State *t_e;
  bool bVar3;
  size_t *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong uVar4;
  Boxed_Value BVar5;
  string_view t_name;
  Scope_Push_Pop spp;
  undefined1 local_a0 [16];
  Boxed_Value match_value;
  Type_Conversions_State local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_60 [16];
  array<chaiscript::Boxed_Value,_2UL> p;
  
  chaiscript::detail::Dispatch_Engine::new_scope((Stack_Holder *)in_RDX[1]);
  AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
            ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)&match_value,
             (Dispatch_State *)
             ((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock.__align);
  uVar4 = 1;
  bVar3 = false;
  do {
    pTVar2 = t_ss[2].m_conversions.m_conversions._M_data;
    if ((ulong)((long)t_ss[2].m_conversions.m_saves._M_data - (long)pTVar2 >> 3) <= uVar4) {
      void_var();
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&match_value.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      detail::Scope_Push_Pop::~Scope_Push_Pop(&spp);
      BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = extraout_RDX._M_pi;
      BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)this;
      return (Boxed_Value)
             BVar5.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
    }
    t_e = *(Dispatch_State **)((long)&(pTVar2->m_mutex)._M_impl._M_rwlock + uVar4 * 8);
    iVar1 = *(int *)&(t_e->m_stack_holder)._M_data;
    if (iVar1 == 0x25) {
      AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
                ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)&stack0xffffffffffffff90,
                 t_e);
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
      bVar3 = true;
    }
    else if (iVar1 == 0x24) {
      Catch::clara::std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)&p,
                   (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
                   &match_value);
      AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
                ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)(p._M_elems + 1),
                 (Dispatch_State *)
                 **(undefined8 **)
                   (*(long *)((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex).
                                     _M_impl._M_rwlock + uVar4 * 8) + 0x50));
      if (bVar3) {
LAB_00575d8c:
        AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
                  ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)local_60,
                   *(Dispatch_State **)
                    ((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl.
                            _M_rwlock + uVar4 * 8));
        Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
        bVar3 = true;
      }
      else {
        local_80.m_saves._M_data = (Conversion_Saves *)&stack0xffffffffffffffd0;
        t_name._M_str = (char *)0x2;
        t_name._M_len = *in_RDX;
        local_80.m_conversions._M_data = (Type_Conversions *)&p;
        chaiscript::detail::Dispatch_Engine::call_function
                  ((Dispatch_Engine *)local_a0,t_name,(atomic_uint_fast32_t *)"==",
                   (Function_Params *)&t_ss[3].m_stack_holder,&local_80);
        bVar3 = boxed_cast<bool>((Boxed_Value *)local_a0,(Type_Conversions_State *)0x0);
        Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
        if (bVar3) goto LAB_00575d8c;
        bVar3 = false;
      }
      Catch::clara::std::array<chaiscript::Boxed_Value,_2UL>::~array(&p);
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        bool breaking = false;
        size_t currentCase = 1;
        bool hasMatched = false;

        chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);

        Boxed_Value match_value(this->children[0]->eval(t_ss));

        while (!breaking && (currentCase < this->children.size())) {
          try {
            if (this->children[currentCase]->identifier == AST_Node_Type::Case) {
              // This is a little odd, but because want to see both the switch and the case simultaneously, I do a downcast here.
              try {
                std::array<Boxed_Value, 2> p{match_value, this->children[currentCase]->children[0]->eval(t_ss)};
                if (hasMatched || boxed_cast<bool>(t_ss->call_function("==", m_loc, Function_Params{p}, t_ss.conversions()))) {
                  this->children[currentCase]->eval(t_ss);
                  hasMatched = true;
                }
              } catch (const exception::bad_boxed_cast &) {
                throw exception::eval_error("Internal error: case guard evaluation not boolean");
              }
            } else if (this->children[currentCase]->identifier == AST_Node_Type::Default) {
              this->children[currentCase]->eval(t_ss);
              hasMatched = true;
            }
          } catch (detail::Break_Loop &) {
            breaking = true;
          }
          ++currentCase;
        }
        return void_var();
      }